

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::IfStatement(SQCompiler *this)

{
  SQObjectType SVar1;
  SQCompiler *this_00;
  SQInteger arg1;
  SQObjectValue this_01;
  SQFuncState *in_RDI;
  SQObject SVar2;
  SQInteger endifblock;
  SQInteger jnepos;
  SQInteger in_stack_00000040;
  SQCompiler *in_stack_00000048;
  bool haselse;
  SQInteger jmppos;
  SQCompiler *in_stack_ffffffffffffffa0;
  SQLocalVarInfo *arg3;
  SQInteger in_stack_ffffffffffffffb8;
  SQInteger in_stack_ffffffffffffffc0;
  SQOpcode in_stack_ffffffffffffffcc;
  
  Lex(in_stack_ffffffffffffffa0);
  Expect(in_stack_00000048,in_stack_00000040);
  CommaExpr(in_stack_ffffffffffffffa0);
  SVar2 = Expect(in_stack_00000048,in_stack_00000040);
  this_01 = SVar2._unVal;
  SVar1 = SVar2._type;
  arg3 = (in_RDI->_vlocals)._vals;
  SQFuncState::PopTarget(in_RDI);
  SQFuncState::AddInstruction
            ((SQFuncState *)this_01.pTable,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,(SQInteger)in_RDI,(SQInteger)arg3);
  this_00 = (SQCompiler *)SQFuncState::GetCurrentPos((SQFuncState *)0x113c3b);
  IfBlock(this_00);
  arg1 = SQFuncState::GetCurrentPos((SQFuncState *)0x113c58);
  if (in_RDI->_returnexp == 0x111) {
    SQFuncState::AddInstruction
              ((SQFuncState *)this_01.pTable,in_stack_ffffffffffffffcc,(SQInteger)this_00,arg1,
               (SQInteger)in_RDI,(SQInteger)arg3);
    SQFuncState::GetCurrentPos((SQFuncState *)0x113ca6);
    Lex(in_stack_ffffffffffffffa0);
    IfBlock(this_00);
    SQFuncState::GetCurrentPos((SQFuncState *)0x113cdf);
    SQFuncState::SetInstructionParam
              ((SQFuncState *)this_01.pTable,CONCAT44(in_stack_ffffffffffffffcc,SVar1),
               (SQInteger)this_00,arg1);
  }
  SQFuncState::SetInstructionParam
            ((SQFuncState *)this_01.pTable,CONCAT44(in_stack_ffffffffffffffcc,SVar1),
             (SQInteger)this_00,arg1);
  return;
}

Assistant:

void IfStatement()
    {
        SQInteger jmppos;
        bool haselse = false;
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        SQInteger jnepos = _fs->GetCurrentPos();



        IfBlock();
        //
        /*static int n = 0;
        if (_token != _SC('}') && _token != TK_ELSE) {
            printf("IF %d-----------------------!!!!!!!!!\n", n);
            if (n == 5)
            {
                printf("asd");
            }
            n++;
            //OptionalSemicolon();
        }*/


        SQInteger endifblock = _fs->GetCurrentPos();
        if(_token == TK_ELSE){
            haselse = true;
            //BEGIN_SCOPE();
            _fs->AddInstruction(_OP_JMP);
            jmppos = _fs->GetCurrentPos();
            Lex();
            //Statement(); if(_lex._prevtoken != _SC('}')) OptionalSemicolon();
            IfBlock();
            //END_SCOPE();
            _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
        }
        _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (haselse?1:0));
    }